

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlareState.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::FlareState::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,FlareState *this)

{
  ostream *poVar1;
  KStringStream ss;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  EnvironmentRecord::GetAsString_abi_cxx11_(&local_1c0,&this->super_EnvironmentRecord);
  poVar1 = std::operator<<(local_190,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"\tTime Since Creation:   ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tSource:                ");
  EntityType::GetAsString_abi_cxx11_(&local_1e0,&this->m_Src);
  poVar1 = std::operator<<(poVar1,(string *)&local_1e0);
  poVar1 = std::operator<<(poVar1,"\tNumber Intensity:      ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tNumber Of Sources:     ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tGeometry Index:        ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16GeometryIndex);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString FlareState::GetAsString() const
{
    KStringStream ss;

    ss << EnvironmentRecord::GetAsString()
       << "\tTime Since Creation:   " << m_ui32TSC                 << "\n"
       << "\tSource:                " << m_Src.GetAsString()
       << "\tNumber Intensity:      " << m_ui32NumInt            << "\n"
       << "\tNumber Of Sources:     " << m_ui32NumSrcs          << "\n"
       << "\tGeometry Index:        " << m_ui16GeometryIndex   << "\n";

    return ss.str();
}